

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

uint8_t __thiscall CPU::GetStackByte(CPU *this)

{
  int iVar1;
  
  this->cycles = this->cycles - 1;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(this->sp + 0x101));
  this->sp = this->sp + '\x01';
  this->cycles = this->cycles - 1;
  return (uint8_t)iVar1;
}

Assistant:

uint8_t CPU::GetStackByte()
{
    uint8_t data = ReadByte((0x100 | sp) + 1);
    sp++;
    cycles--;
    return data;
}